

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

bool __thiscall cmake::GetDevWarningsAsErrors(cmake *this,cmMakefile *mf)

{
  cmState *this_00;
  bool bVar1;
  char *val;
  allocator local_4a;
  allocator local_49;
  string local_48;
  string local_28;
  
  if (mf == (cmMakefile *)0x0) {
    this_00 = this->State;
    std::__cxx11::string::string
              ((string *)&local_48,"CMAKE_SUPPRESS_DEVELOPER_ERRORS",(allocator *)&local_28);
    val = cmState::GetCacheEntryValue(this_00,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    if (val == (char *)0x0) {
      bVar1 = false;
    }
    else {
      bVar1 = cmSystemTools::IsOff(val);
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_48,"CMAKE_SUPPRESS_DEVELOPER_ERRORS",&local_49);
    bVar1 = cmMakefile::IsSet(mf,&local_48);
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_28,"CMAKE_SUPPRESS_DEVELOPER_ERRORS",&local_4a);
      bVar1 = cmMakefile::IsOn(mf,&local_28);
      bVar1 = !bVar1;
      std::__cxx11::string::~string((string *)&local_28);
    }
    else {
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)&local_48);
  }
  return bVar1;
}

Assistant:

bool cmake::GetDevWarningsAsErrors(cmMakefile const* mf)
{
  if (mf)
    {
    return (mf->IsSet("CMAKE_SUPPRESS_DEVELOPER_ERRORS") &&
            !mf->IsOn("CMAKE_SUPPRESS_DEVELOPER_ERRORS"));
    }
  else
    {
    const char* cacheEntryValue = this->State->GetCacheEntryValue(
      "CMAKE_SUPPRESS_DEVELOPER_ERRORS");
    return cacheEntryValue && cmSystemTools::IsOff(cacheEntryValue);
    }
}